

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseUDP.h
# Opt level: O2

void __thiscall tonk::UDPSocket::~UDPSocket(UDPSocket *this)

{
  (this->super_IUDPSender)._vptr_IUDPSender = (_func_int **)&PTR__UDPSocket_001c54b8;
  LOCK();
  ActiveUDPSocketCount = ActiveUDPSocketCount + -1;
  UNLOCK();
  LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_unsigned_int,_tonk::UDPAddressHasher>::
  ~LightHashMap(&(this->FloodDetect).CountMap);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->AsioConnectStrand).
              super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  ::~unique_ptr(&this->Socket);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->Deps).Context.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  (this->AddressMap)._vptr_ConnectionAddrMap = (_func_int **)&PTR__ConnectionAddrMap_001c5378;
  LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::IConnection_*,_tonk::UDPAddressHasher>
  ::~LightHashMap(&(this->AddressMap).AddressMap.TheMap);
  operator_delete(this);
  return;
}

Assistant:

TONK_FORCE_INLINE virtual ~UDPSocket()
    {
        ActiveUDPSocketCount--;
    }